

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O2

void ClownLZSS::Internal::Gba::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint uncompressed_size)

{
  bool bVar1;
  byte value;
  byte bVar2;
  pos_type pVar3;
  pos_type pVar4;
  BitField<decltype(input)> descriptor_bits;
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  RStack_48;
  
  pVar3 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
          ::Tell(&output->
                  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                );
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader(&RStack_48,input);
  while( true ) {
    pVar4 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
            ::Tell(&output->
                    super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                  );
    if ((long)(ulong)uncompressed_size <= pVar4._M_off - pVar3._M_off) break;
    bVar1 = BitField::
            Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            ::Pop(&RStack_48);
    value = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::ReadImplementation
                      (&input->
                        super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      );
    if (bVar1) {
      bVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::Copy
                (output,(uint)bVar2 + (value & 0xf) * 0x100 + 1,(value >> 4) + 3);
    }
    else {
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
      WriteImplementation(output,value);
    }
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, unsigned int uncompressed_size)
			{
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (output.Distance(output_start_position) < uncompressed_size)
				{
					if (!descriptor_bits.Pop())
					{
						// Literal
						output.Write(input.Read());
					}
					else
					{
						// Match
						const unsigned int b0 = input.Read();
						const unsigned int b1 = input.Read();
						const unsigned int count = ((b0 >> 4) & 0xf) + Decompressor::minimum_match_length;
						const unsigned int distance = (((b0 & 0xfu) << 8) | b1) + Decompressor::minimum_match_distance;
						output.Copy(distance, count);
					}
				}
			}